

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

Aig_Obj_t * Aig_ObjChild1CopyVec(Vec_Ptr_t *vCopy,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  Vec_Ptr_t *vCopy_local;
  
  iVar1 = Aig_ObjFaninId1(pObj);
  pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vCopy,iVar1);
  iVar1 = Aig_ObjFaninC1(pObj);
  pAVar2 = Aig_NotCond(pAVar2,iVar1);
  return pAVar2;
}

Assistant:

static inline Aig_Obj_t *  Aig_ObjChild1CopyVec( Vec_Ptr_t * vCopy, Aig_Obj_t * pObj )  
{ return Aig_NotCond((Aig_Obj_t *)Vec_PtrEntry(vCopy, Aig_ObjFaninId1(pObj)), Aig_ObjFaninC1(pObj));  }